

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall jsonnet::internal::FixNewlines::expand(FixNewlines *this,ArrayComprehension *comp)

{
  pointer pCVar1;
  AST *pAVar2;
  ComprehensionSpec *spec;
  pointer pCVar3;
  
  pAVar2 = left_recursive_deep(comp->body);
  ensureCleanNewline(&pAVar2->openFodder);
  pCVar1 = (comp->specs).
           super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar3 = (comp->specs).
                super__Vector_base<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar3 != pCVar1; pCVar3 = pCVar3 + 1) {
    ensureCleanNewline(&pCVar3->openFodder);
  }
  ensureCleanNewline(&comp->closeFodder);
  return;
}

Assistant:

void expand(ArrayComprehension *comp)
    {
        ensureCleanNewline(open_fodder(comp->body));
        for (auto &spec : comp->specs) {
            ensureCleanNewline(spec.openFodder);
        }
        ensureCleanNewline(comp->closeFodder);
    }